

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

bool __thiscall QAccessibleTable::unselectColumn(QAccessibleTable *this,int column)

{
  QAccessibleObject *pQVar1;
  char cVar2;
  SelectionMode SVar3;
  int iVar4;
  QAbstractItemView *pQVar5;
  QAbstractItemModel *pQVar6;
  QItemSelectionModel *pQVar7;
  QAbstractItemModel *pQVar8;
  bool bVar9;
  long in_FS_OFFSET;
  QModelIndex local_e8;
  QArrayDataPointer<QItemSelectionRange> local_d0;
  QArrayDataPointer<QItemSelectionRange> local_b8;
  QModelIndex local_98;
  QModelIndex local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  pQVar5 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar6 = QAbstractItemView::model(pQVar5);
  pQVar7 = QAbstractItemView::selectionModel(pQVar5);
  if (pQVar7 == (QItemSelectionModel *)0x0 || pQVar6 == (QAbstractItemModel *)0x0) {
    bVar9 = false;
    goto LAB_005326a9;
  }
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex(&local_78,pQVar5);
  local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.r = -0x55555556;
  local_98.c = -0x55555556;
  local_98.i._0_4_ = 0xaaaaaaaa;
  local_98.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
  pQVar5 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar8 = QAbstractItemView::model(pQVar5);
  (**(code **)(*(long *)pQVar8 + 0x60))(&local_98,pQVar8,0,column,&local_78);
  bVar9 = false;
  if (((local_98.r < 0) || (bVar9 = false, local_98.c < 0)) ||
     (local_98.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_005326a9;
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)&local_b8,&local_98,&local_98);
  (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
  pQVar5 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  SVar3 = QAbstractItemView::selectionMode(pQVar5);
  if (SVar3 == ContiguousSelection) {
    iVar4 = (**(code **)(*(long *)this + 0x48))(this);
    if (iVar4 == 1) goto LAB_005325bc;
    if (((column == 0) ||
        (cVar2 = QItemSelectionModel::isColumnSelected
                           ((int)pQVar7,(QModelIndex *)(ulong)(column - 1)), cVar2 != '\0')) &&
       (cVar2 = QItemSelectionModel::isColumnSelected
                          ((int)pQVar7,(QModelIndex *)(ulong)(column + 1)), cVar2 != '\0')) {
      iVar4 = (**(code **)(*(long *)this + 0x58))(this);
      (**(code **)(*(long *)pQVar6 + 0x60))(&local_e8,pQVar6,0,iVar4 + -1,&local_78);
      QItemSelection::QItemSelection((QItemSelection *)&local_d0,&local_98,&local_e8);
      local_58.size = local_b8.size;
      local_58.ptr = local_b8.ptr;
      local_58.d = local_b8.d;
      local_b8.size = local_d0.size;
      local_b8.ptr = local_d0.ptr;
      local_b8.d = local_d0.d;
      local_d0.d = (Data *)0x0;
      local_d0.ptr = (QItemSelectionRange *)0x0;
      local_d0.size = 0;
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_d0);
    }
LAB_00532688:
    (**(code **)(*(long *)pQVar7 + 0x70))(pQVar7,&local_b8,0x44);
    bVar9 = true;
  }
  else {
    if ((SVar3 != SingleSelection) ||
       (iVar4 = (**(code **)(*(long *)this + 0x48))(this), iVar4 != 1)) goto LAB_00532688;
LAB_005325bc:
    bVar9 = false;
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b8);
LAB_005326a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QAccessibleTable::unselectColumn(int column)
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = view()->model()->index(0, column, rootIndex);
    if (!index.isValid())
        return false;

    QItemSelection selection(index, index);

    switch (view()->selectionMode()) {
    case QAbstractItemView::SingleSelection:
        //In SingleSelection and ContiguousSelection once an item
        //is selected, there's no way for the user to unselect all items
        if (selectedColumnCount() == 1)
            return false;
        break;
    case QAbstractItemView::ContiguousSelection:
        if (selectedColumnCount() == 1)
            return false;

        if ((!column || selectionModel->isColumnSelected(column - 1, rootIndex))
            && selectionModel->isColumnSelected(column + 1, rootIndex)) {
            //If there are columns selected both at the left of the current row and at the right
            //of the current rown, the ones which are at the right will be deselected
            selection = QItemSelection(index, theModel->index(0, columnCount() - 1, rootIndex));
        }
        break;
    default:
        break;
    }

    selectionModel->select(selection, QItemSelectionModel::Deselect | QItemSelectionModel::Columns);
    return true;
}